

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void ppu_end_vblank(gba_ppu_t *ppu)

{
  bg_referencepoint_t bVar1;
  
  bVar1 = (ppu->BG2Y).initial;
  (ppu->BG2X).current = (ppu->BG2X).initial;
  (ppu->BG3X).current = (ppu->BG3X).initial;
  (ppu->BG2Y).current = bVar1;
  (ppu->BG3Y).current = (ppu->BG3Y).initial;
  ppu->y = 0;
  check_vcount(ppu);
  if ((dbg_window_visible == true) && (tick_on == FRAME)) {
    actual_dbg_tick();
  }
  *(byte *)&ppu->DISPSTAT = *(byte *)&ppu->DISPSTAT & 0xfe;
  return;
}

Assistant:

void ppu_end_vblank(gba_ppu_t* ppu) {
    ppu->BG2X.current.raw = ppu->BG2X.initial.raw;
    ppu->BG3X.current.raw = ppu->BG3X.initial.raw;
    ppu->BG2Y.current.raw = ppu->BG2Y.initial.raw;
    ppu->BG3Y.current.raw = ppu->BG3Y.initial.raw;

    ppu->y = 0;
    check_vcount(ppu);
    dbg_tick(FRAME);
    ppu->DISPSTAT.vblank = false;
}